

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autotune.cc
# Opt level: O2

void __thiscall fasttext::AutotuneStrategy::updateBest(AutotuneStrategy *this,Args *args)

{
  int iVar1;
  AutotuneStrategy *this_00;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  
  auVar3 = in_ZMM0._0_16_;
  this_00 = this;
  Args::operator=(&this->bestArgs_,args);
  iVar1 = getIndex(this_00,args->minn,&this->minnChoices_);
  this->bestMinnIndex_ = iVar1;
  auVar3 = vcvtusi2sd_avx512f(auVar3,args->dsub);
  dVar2 = log2(auVar3._0_8_);
  this->bestDsubExponent_ = (int)dVar2;
  if (args->bucket != 0) {
    this->bestNonzeroBucket_ = args->bucket;
  }
  return;
}

Assistant:

void AutotuneStrategy::updateBest(const Args& args) {
  bestArgs_ = args;
  bestMinnIndex_ = getIndex(args.minn, minnChoices_);
  bestDsubExponent_ = log2(args.dsub);
  if (args.bucket != 0) {
    bestNonzeroBucket_ = args.bucket;
  }
}